

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# peer_class.cpp
# Opt level: O0

void __thiscall libtorrent::peer_class::set_info(peer_class *this,peer_class_info *pci)

{
  int iVar1;
  int *piVar2;
  reference pvVar3;
  int local_28 [4];
  peer_class_info *local_18;
  peer_class_info *pci_local;
  peer_class *this_local;
  
  this->ignore_unchoke_slots = (bool)(pci->ignore_unchoke_slots & 1);
  this->connection_limit_factor = pci->connection_limit_factor;
  local_18 = pci;
  pci_local = (peer_class_info *)this;
  ::std::__cxx11::string::operator=((string *)&this->label,(string *)&pci->label);
  set_upload_limit(this,local_18->upload_limit);
  set_download_limit(this,local_18->download_limit);
  local_28[3] = 1;
  local_28[2] = 0xff;
  piVar2 = ::std::min<int>(local_28 + 2,&local_18->upload_priority);
  piVar2 = ::std::max<int>(local_28 + 3,piVar2);
  iVar1 = *piVar2;
  pvVar3 = ::std::array<int,_2UL>::operator[](&this->priority,0);
  *pvVar3 = iVar1;
  local_28[1] = 1;
  local_28[0] = 0xff;
  piVar2 = ::std::min<int>(local_28,&local_18->download_priority);
  piVar2 = ::std::max<int>(local_28 + 1,piVar2);
  iVar1 = *piVar2;
  pvVar3 = ::std::array<int,_2UL>::operator[](&this->priority,1);
  *pvVar3 = iVar1;
  return;
}

Assistant:

void peer_class::set_info(peer_class_info const* pci)
	{
		ignore_unchoke_slots = pci->ignore_unchoke_slots;
		connection_limit_factor = pci->connection_limit_factor;
		label = pci->label;
		set_upload_limit(pci->upload_limit);
		set_download_limit(pci->download_limit);
		priority[aux::peer_connection::upload_channel] = std::max(1, std::min(255, pci->upload_priority));
		priority[aux::peer_connection::download_channel] = std::max(1, std::min(255, pci->download_priority));
	}